

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  DbClientData *pDVar1;
  int iVar2;
  int in_ESI;
  sqlite3 *in_RDI;
  sqlite3 *unaff_retaddr;
  DbClientData *p;
  undefined4 in_stack_00000010;
  sqlite3 *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == (sqlite3 *)0x0) {
    local_4 = 0;
  }
  else {
    iVar2 = sqlite3SafetyCheckSickOrOk(in_stack_ffffffffffffffd8);
    if (iVar2 == 0) {
      local_4 = sqlite3MisuseError(0);
    }
    else {
      sqlite3_mutex_enter((sqlite3_mutex *)0x14b102);
      if ((in_RDI->mTrace & 8) != 0) {
        (*(in_RDI->trace).xLegacy)((void *)0x8,(char *)in_RDI->pTraceArg);
      }
      disconnectAllVtab(unaff_retaddr);
      sqlite3VtabRollback((sqlite3 *)0x14b14d);
      if ((in_ESI == 0) &&
         (iVar2 = connectionIsBusy((sqlite3 *)(ulong)in_stack_ffffffffffffffe8), iVar2 != 0)) {
        sqlite3ErrorWithMsg(in_RDI,5,
                            "unable to close due to unfinalized statements or unfinished backups");
        sqlite3_mutex_leave((sqlite3_mutex *)0x14b189);
        local_4 = 5;
      }
      else {
        while (in_RDI->pDbData != (DbClientData *)0x0) {
          pDVar1 = in_RDI->pDbData;
          in_RDI->pDbData = pDVar1->pNext;
          if (pDVar1->xDestructor != (_func_void_void_ptr *)0x0) {
            (*pDVar1->xDestructor)(pDVar1->pData);
          }
          sqlite3_free((void *)0x14b1f3);
        }
        in_RDI->eOpenState = 0xa7;
        sqlite3LeaveMutexAndCloseZombie((sqlite3 *)CONCAT44(forceZombie,in_stack_00000010));
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    /* EVIDENCE-OF: R-63257-11740 Calling sqlite3_close() or
    ** sqlite3_close_v2() with a NULL pointer argument is a harmless no-op. */
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mTrace & SQLITE_TRACE_CLOSE ){
    db->trace.xV2(SQLITE_TRACE_CLOSE, db->pTraceArg, db, 0);
  }

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3ErrorWithMsg(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  while( db->pDbData ){
    DbClientData *p = db->pDbData;
    db->pDbData = p->pNext;
    assert( p->pData!=0 );
    if( p->xDestructor ) p->xDestructor(p->pData);
    sqlite3_free(p);
  }

  /* Convert the connection into a zombie and then close it.
  */
  db->eOpenState = SQLITE_STATE_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}